

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uds_socket_ping_pong.c
# Opt level: O1

int main(int argc,char **argv)

{
  cio_error cVar1;
  cio_address_family cVar2;
  __sighandler_t p_Var3;
  uint uVar4;
  char path [13];
  cio_server_socket server_socket;
  cio_socket_address client_endpoint;
  cio_socket_address endpoint;
  cio_socket socket;
  undefined8 local_198;
  undefined8 uStack_190;
  
  if (argc == 2) {
    max_pings = strtoul(argv[1],(char **)0x0,10);
    if (max_pings != 0xffffffffffffffff) {
      p_Var3 = signal(0xf,sighandler);
      if (p_Var3 == (__sighandler_t)0xffffffffffffffff) {
        main_cold_11();
      }
      else {
        p_Var3 = signal(2,sighandler);
        if (p_Var3 == (__sighandler_t)0xffffffffffffffff) {
          main_cold_10();
        }
        else {
          builtin_strncpy(path + 8,"obar",5);
          path[0] = '\0';
          path[1] = '/';
          path[2] = 't';
          path[3] = 'm';
          path[4] = 'p';
          path[5] = '/';
          path[6] = 'f';
          path[7] = 'o';
          cVar1 = cio_init_uds_socket_address(&endpoint,path);
          if (cVar1 == CIO_SUCCESS) {
            cVar1 = cio_eventloop_init(&loop);
            if (cVar1 != CIO_SUCCESS) {
              return 1;
            }
            cVar2 = cio_socket_address_get_family(&endpoint);
            cVar1 = cio_server_socket_init
                              (&server_socket,&loop,5,cVar2,alloc_echo_client,free_echo_client,
                               1000000000,(cio_server_socket_close_hook_t)0x0);
            if (cVar1 == CIO_SUCCESS) {
              uVar4 = 1;
              cVar1 = cio_server_socket_set_reuse_address(&server_socket,true);
              if (cVar1 == CIO_SUCCESS) {
                cVar1 = cio_server_socket_bind(&server_socket,&endpoint);
                if (cVar1 == CIO_SUCCESS) {
                  cVar1 = cio_server_socket_accept(&server_socket,handle_accept,(void *)0x0);
                  if (cVar1 == CIO_SUCCESS) {
                    cVar1 = cio_init_uds_socket_address(&client_endpoint,path);
                    if (cVar1 == CIO_SUCCESS) {
                      cVar2 = cio_socket_address_get_family(&client_endpoint);
                      cVar1 = cio_socket_init(&socket,cVar2,&loop,1000000000,
                                              client_socket_close_hook);
                      if (cVar1 == CIO_SUCCESS) {
                        local_198 = 0;
                        uStack_190 = 0;
                        cVar1 = cio_socket_connect(&socket,&client_endpoint,handle_connect,
                                                   &local_198);
                        if (cVar1 == CIO_SUCCESS) {
                          cVar1 = cio_eventloop_run(&loop);
                          uVar4 = (uint)(cVar1 != CIO_SUCCESS);
                        }
                        else {
                          main_cold_9();
                        }
                      }
                      else {
                        main_cold_8();
                      }
                    }
                    else {
                      main_cold_7();
                    }
                  }
                  else {
                    main_cold_6();
                  }
                }
                else {
                  main_cold_5();
                }
              }
              else {
                main_cold_4();
              }
              cio_server_socket_close(&server_socket);
            }
            else {
              main_cold_3();
              uVar4 = 1;
            }
            cio_eventloop_destroy(&loop);
            return uVar4;
          }
          main_cold_2();
        }
      }
      return -1;
    }
    main_cold_12();
  }
  else {
    main_cold_1();
  }
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
	if (argc != 2) {
		usage(argv[0]);
		return EXIT_FAILURE;
	}

	max_pings = strtoul(argv[1], NULL, BASE_10);
	if (max_pings == ULLONG_MAX) {
		usage(argv[0]);
		return EXIT_FAILURE;
	}

	int ret = EXIT_SUCCESS;
	if (signal(SIGTERM, sighandler) == SIG_ERR) {
		(void)fprintf(stderr, "could no install SIGTERM handler!\n");
		return -1;
	}

	if (signal(SIGINT, sighandler) == SIG_ERR) {
		(void)fprintf(stderr, "could no install SIGINT handler!\n");
		(void)signal(SIGTERM, SIG_DFL);
		return -1;
	}

	struct cio_socket_address endpoint;
	const char path[] = {"\0/tmp/foobar"};
	enum cio_error err = cio_init_uds_socket_address(&endpoint, path);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could no init server socket endpoint!\n");
		return -1;
	}

	err = cio_eventloop_init(&loop);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return EXIT_FAILURE;
	}

	struct cio_server_socket server_socket;
	err = cio_server_socket_init(&server_socket, &loop, SERVERSOCKET_BACKLOG, cio_socket_address_get_family(&endpoint), alloc_echo_client, free_echo_client, CLOSE_TIMEOUT_NS, NULL);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not init server socket!\n");
		ret = EXIT_FAILURE;
		goto destroy_loop;
	}

	err = cio_server_socket_set_reuse_address(&server_socket, true);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not set reuse_address for server socket!\n");
		ret = EXIT_FAILURE;
		goto close_server_socket;
	}

	err = cio_server_socket_bind(&server_socket, &endpoint);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not bind server socket!\n");
		ret = EXIT_FAILURE;
		goto close_server_socket;
	}

	err = cio_server_socket_accept(&server_socket, handle_accept, NULL);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not run accept on server socket!\n");
		ret = EXIT_FAILURE;
		goto close_server_socket;
	}

	struct cio_socket_address client_endpoint;
	err = cio_init_uds_socket_address(&client_endpoint, path);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not init client socket endpoint!\n");
		ret = EXIT_FAILURE;
		goto close_server_socket;
	}

	struct cio_socket socket;
	err = cio_socket_init(&socket, cio_socket_address_get_family(&client_endpoint), &loop, CLOSE_TIMEOUT_NS, client_socket_close_hook);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not init client socket endpoint!\n");
		ret = EXIT_FAILURE;
		goto close_server_socket;
	}

	struct client client;
	client.bytes_read = 0;
	client.number_of_pings = 0;

	err = cio_socket_connect(&socket, &client_endpoint, handle_connect, &client);
	if (err != CIO_SUCCESS) {
		(void)fprintf(stderr, "could not connect to server!\n");
		ret = EXIT_FAILURE;
		goto close_server_socket;
	}

	err = cio_eventloop_run(&loop);
	if (err != CIO_SUCCESS) {
		ret = EXIT_FAILURE;
	}

close_server_socket:
	cio_server_socket_close(&server_socket);
destroy_loop:
	cio_eventloop_destroy(&loop);
	return ret;
}